

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O1

void __thiscall
LNodeEStmt::LNodeEStmt(LNodeEStmt *this,shared_ptr<LNode> *vars,shared_ptr<LNode> *expr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->vars).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->vars).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (vars->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (vars->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (vars->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (vars->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->vars).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->vars).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->vars).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

LNodeEStmt(std::shared_ptr<LNode> vars, std::shared_ptr<LNode> expr) {
        this->vars = std::move(vars);
        this->expr = std::move(expr);
    }